

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  undefined4 in_register_0000000c;
  int in_EDX;
  int sock;
  int family;
  int sock_00;
  int family_00;
  int sock_01;
  int sock_02;
  int sock_03;
  int sock_04;
  int family_01;
  int sock_05;
  int family_02;
  int sock_06;
  int family_03;
  int sock_07;
  int sock_08;
  int sock_09;
  int sock_10;
  
  iVar1 = test_socket_impl((char *)0x27,0x50,in_EDX,in_ECX);
  test_bind_impl((char *)0x28,iVar1,sock,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar2 = test_socket_impl((char *)0x29,0x51,family,in_ECX);
  test_connect_impl((char *)0x2a,iVar2,sock_00,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar3 = test_socket_impl((char *)0x2b,0x51,family_00,in_ECX);
  test_connect_impl((char *)0x2c,iVar3,sock_01,(char *)CONCAT44(in_register_0000000c,in_ECX));
  nn_sleep(10);
  test_send_impl((char *)0x32,iVar1,0x102116,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_send_impl((char *)0x33,iVar1,0x10211a,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_recv_impl((char *)0x35,iVar2,0x102116,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_recv_impl((char *)0x36,iVar3,0x10211a,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_close_impl((char *)0x38,iVar1,sock_02);
  test_close_impl((char *)0x39,iVar2,sock_03);
  test_close_impl((char *)0x3a,iVar3,sock_04);
  iVar1 = test_socket_impl((char *)0x3e,0x51,family_01,in_ECX);
  test_bind_impl((char *)0x3f,iVar1,sock_05,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar2 = test_socket_impl((char *)0x40,0x50,family_02,in_ECX);
  test_connect_impl((char *)0x41,iVar2,sock_06,(char *)CONCAT44(in_register_0000000c,in_ECX));
  iVar3 = test_socket_impl((char *)0x42,0x50,family_03,in_ECX);
  test_connect_impl((char *)0x43,iVar3,sock_07,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_send_impl((char *)0x45,iVar2,0x102116,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_send_impl((char *)0x46,iVar3,0x10211a,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_recv_impl((char *)0x48,iVar1,0x102116,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_recv_impl((char *)0x49,iVar1,0x10211a,(char *)CONCAT44(in_register_0000000c,in_ECX));
  test_close_impl((char *)0x4b,iVar1,sock_08);
  test_close_impl((char *)0x4c,iVar2,sock_09);
  test_close_impl((char *)0x4d,iVar3,sock_10);
  return 0;
}

Assistant:

int main ()
{
    int push1;
    int push2;
    int pull1;
    int pull2;

    /*  Test fan-out. */

    push1 = test_socket (AF_SP, NN_PUSH);
    test_bind (push1, SOCKET_ADDRESS);
    pull1 = test_socket (AF_SP, NN_PULL);
    test_connect (pull1, SOCKET_ADDRESS);
    pull2 = test_socket (AF_SP, NN_PULL);
    test_connect (pull2, SOCKET_ADDRESS);

    /*  Wait till both connections are established to get messages spread
        evenly between the two pull sockets. */
    nn_sleep (10);

    test_send (push1, "ABC");
    test_send (push1, "DEF");

    test_recv (pull1, "ABC");
    test_recv (pull2, "DEF");

    test_close (push1);
    test_close (pull1);
    test_close (pull2);

    /*  Test fan-in. */

    pull1 = test_socket (AF_SP, NN_PULL);
    test_bind (pull1, SOCKET_ADDRESS);
    push1 = test_socket (AF_SP, NN_PUSH);
    test_connect (push1, SOCKET_ADDRESS);
    push2 = test_socket (AF_SP, NN_PUSH);
    test_connect (push2, SOCKET_ADDRESS);

    test_send (push1, "ABC");
    test_send (push2, "DEF");

    test_recv (pull1, "ABC");
    test_recv (pull1, "DEF");

    test_close (pull1);
    test_close (push1);
    test_close (push2);

    return 0;
}